

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Client.cpp
# Opt level: O0

int __thiscall Client::do_recv(Client *this,int fd)

{
  int __fd;
  FILE *pFVar1;
  size_t sVar2;
  ssize_t sVar3;
  int *piVar4;
  char *pcVar5;
  undefined8 uVar6;
  undefined8 in_stack_ffffffffffffff98;
  undefined4 uVar7;
  int local_20;
  int nrecv;
  int fd_local;
  Client *this_local;
  
  uVar7 = (undefined4)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  if (((fd == this->_sock_fd) && (sVar2 = Buff::left_size(&this->_sock2stdout), sVar2 == 0)) ||
     ((fd == 0 && (sVar2 = Buff::left_size(&this->_stdin2sock), sVar2 == 0)))) {
    if (fd == this->_sock_fd) {
      fprintf(_stderr,
              "%s(%d)-<%s>: sock_fd can read, but _sock2stdout have no empty space to read!\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Wangzhike[P]epoll_echo/Client.cpp"
              ,0x86,"do_recv");
      fflush(_stderr);
    }
    else if (fd == 0) {
      fprintf(_stderr,"%s(%d)-<%s>: stdin can read, buf _stdin2sock have no empty space to read!\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Wangzhike[P]epoll_echo/Client.cpp"
              ,0x8a,"do_recv");
      fflush(_stderr);
    }
    return -6;
  }
  if (fd == this->_sock_fd) {
    __fd = this->_sock_fd;
    pcVar5 = (this->_sock2stdout)._r_pos;
    sVar2 = Buff::left_size(&this->_sock2stdout);
    sVar3 = read(__fd,pcVar5,sVar2);
    local_20 = (int)sVar3;
  }
  else {
    if (fd != 0) {
      fprintf(_stderr,"%s(%d)-<%s>: unknown fd: %d\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Wangzhike[P]epoll_echo/Client.cpp"
              ,0x9b,"do_recv",(ulong)(uint)fd);
      fflush(_stderr);
      exit(-4);
    }
    pcVar5 = (this->_stdin2sock)._r_pos;
    sVar2 = Buff::left_size(&this->_stdin2sock);
    sVar3 = read(0,pcVar5,sVar2);
    local_20 = (int)sVar3;
  }
  if (local_20 < 0) {
    piVar4 = __errno_location();
    pFVar1 = _stderr;
    if (*piVar4 != 0xb) {
      piVar4 = __errno_location();
      pcVar5 = strerror(*piVar4);
      fprintf(pFVar1,"%s(%d)-<%s>: recv fd:%d occurs error, error %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Wangzhike[P]epoll_echo/Client.cpp"
              ,0xa3,"do_recv",(ulong)(uint)fd,pcVar5);
      fflush(_stderr);
      exit(-5);
    }
  }
  else {
    if (local_20 != 0) {
      fprintf(_stderr,"%s(%d)-<%s>: read done from fd: %d, total nbytes: %d\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Wangzhike[P]epoll_echo/Client.cpp"
              ,0xc6,"do_recv",(ulong)(uint)fd,CONCAT44(uVar7,local_20));
      fflush(_stderr);
      if (fd == this->_sock_fd) {
        Buff::set_r_pow(&this->_sock2stdout,local_20);
      }
      else if (fd == 0) {
        Buff::set_r_pow(&this->_stdin2sock,local_20);
      }
      return 0;
    }
    if (fd == this->_sock_fd) {
      fprintf(_stderr,"%s(%d)-<%s>: read EOF on sock\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Wangzhike[P]epoll_echo/Client.cpp"
              ,0xac,"do_recv");
      fflush(_stderr);
      pFVar1 = _stderr;
      if ((this->_stdineof & 1U) != 0) {
        uVar6 = std::__cxx11::string::c_str();
        fprintf(pFVar1,
                "%s(%d)-<%s>: EOF on sock after EOF on stdin, so disconnect to server[%s:%d]\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Wangzhike[P]epoll_echo/Client.cpp"
                ,0xaf,"do_recv",uVar6,CONCAT44(uVar7,this->_svr_port));
        fflush(_stderr);
        return -1;
      }
      uVar6 = std::__cxx11::string::c_str();
      fprintf(pFVar1,"%s(%d)-<%s>: server[%s:%d] terminated prematurely\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Wangzhike[P]epoll_echo/Client.cpp"
              ,0xb4,"do_recv",uVar6,CONCAT44(uVar7,this->_svr_port));
      fflush(_stderr);
      exit(-2);
    }
    if (fd == 0) {
      fprintf(_stderr,"%s(%d)-<%s>: read EOF on stdin\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Wangzhike[P]epoll_echo/Client.cpp"
              ,0xba,"do_recv");
      fflush(_stderr);
      this->_stdineof = true;
      sVar2 = Buff::data_size(&this->_stdin2sock);
      if (sVar2 == 0) {
        fprintf(_stderr,
                "%s(%d)-<%s>: EOF on stdin and no data to send sock, so shutdown sock write side\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Wangzhike[P]epoll_echo/Client.cpp"
                ,0xbe,"do_recv");
        fflush(_stderr);
        shutdown(this->_sock_fd,1);
        return -3;
      }
    }
  }
  return 0;
}

Assistant:

int Client::do_recv(int fd)
{
    int nrecv;

    if ((fd == _sock_fd && _sock2stdout.left_size() == 0) ||
        (fd == STDIN_FILENO && _stdin2sock.left_size() == 0))
    {
        if (fd == _sock_fd)
        {
            LOG_PRINT("sock_fd can read, but _sock2stdout have no empty space to read!");
        }
        else if (fd == STDIN_FILENO)
        {
            LOG_PRINT("stdin can read, buf _stdin2sock have no empty space to read!")
        }

        return err_clt_recv_nospace;
    }


    if (fd == _sock_fd)
    {
        nrecv = read(_sock_fd, _sock2stdout._r_pos, _sock2stdout.left_size());
    }
    else if (fd == STDIN_FILENO)
    {
        nrecv = read(STDIN_FILENO, _stdin2sock._r_pos, _stdin2sock.left_size());
    }
    else
    {
        LOG_PRINT("unknown fd: %d", fd);
        exit(err_clt_recv_unknown_fd);
    }

    if (nrecv < 0)
    {
        if (errno != EAGAIN)    //也就是 EWOULDBLOCK
        {
            LOG_PRINT("recv fd:%d occurs error, error %s", fd, strerror(errno));
            exit(err_clt_recv_error);

        }
    }
    else if (nrecv == 0)
    {
        if (fd == _sock_fd)
        {
            LOG_PRINT("read EOF on sock");
            if (_stdineof)
            {
                LOG_PRINT("EOF on sock after EOF on stdin, so disconnect to server[%s:%d]", _svr_ip.c_str(), _svr_port);
                return err_clt_recv_disconn;
            }
            else 
            {
                LOG_PRINT("server[%s:%d] terminated prematurely", _svr_ip.c_str(), _svr_port);
                exit(err_clt_recv_svrcrash);
            }
        }
        else if (fd == STDIN_FILENO)
        {
            LOG_PRINT("read EOF on stdin");
            _stdineof = true;
            if (_stdin2sock.data_size() == 0)
            {
                LOG_PRINT("EOF on stdin and no data to send sock, so shutdown sock write side");
                shutdown(_sock_fd, SHUT_WR);
                return err_clt_recv_shutdown_wr;
            }
        }
    }
    else
    {
        LOG_PRINT("read done from fd: %d, total nbytes: %d", fd, nrecv);
        if (fd == _sock_fd)
        {
            _sock2stdout.set_r_pow(nrecv);
        }
        else if (fd == STDIN_FILENO)
        {
            _stdin2sock.set_r_pow(nrecv);
        }
        return err_clt_recv_normal;
    }
    return err_clt_recv_normal;
}